

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsBinarySemaphore.h
# Opt level: O0

void __thiscall
HighsBinarySemaphore::acquire(HighsBinarySemaphore *this,unique_lock<std::mutex> *lockGuard)

{
  int iVar1;
  pointer pDVar2;
  int prev;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_1;
  
  pDVar2 = std::
           unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
           ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                         *)0x4bfc45);
  LOCK();
  iVar1 = (pDVar2->count).super___atomic_base<int>._M_i;
  (pDVar2->count).super___atomic_base<int>._M_i = -1;
  UNLOCK();
  if (iVar1 == 1) {
    pDVar2 = std::
             unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
             ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                           *)0x4bfd39);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    (pDVar2->count).super___atomic_base<int>._M_i = 0;
  }
  else {
    do {
      pDVar2 = std::
               unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
               ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                             *)0x4bfde6);
      std::condition_variable::wait((unique_lock *)&pDVar2->condvar);
      pDVar2 = std::
               unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
               ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                             *)0x4bfe01);
      std::operator&(memory_order_relaxed,__memory_order_mask);
    } while ((pDVar2->count).super___atomic_base<int>._M_i != 1);
    pDVar2 = std::
             unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
             ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                           *)0x4bfe9e);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    (pDVar2->count).super___atomic_base<int>._M_i = 0;
  }
  return;
}

Assistant:

void acquire(std::unique_lock<std::mutex> lockGuard) {
    int prev = data_->count.exchange(-1, std::memory_order_relaxed);
    if (prev == 1) {
      data_->count.store(0, std::memory_order_relaxed);
      return;
    }

    do {
      data_->condvar.wait(lockGuard);
    } while (data_->count.load(std::memory_order_relaxed) != 1);

    data_->count.store(0, std::memory_order_relaxed);
  }